

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *__format;
  timeval tVar7;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    test_cold_1();
    goto LAB_00102953;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    test_cold_13();
    iVar2 = 0x7b;
LAB_0010282a:
    iVar1 = -1;
    lVar4 = 0;
  }
  else {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      test_cold_12();
      iVar2 = 0x7c;
      goto LAB_0010282a;
    }
    iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x2a,1);
      if (iVar2 != 0) {
        test_cold_3();
        goto LAB_0010285c;
      }
      iVar2 = curl_multi_add_handle(lVar3,lVar4);
      if (iVar2 != 0) {
        test_cold_4();
        goto LAB_0010285c;
      }
      iVar2 = curl_multi_perform(lVar3,&local_1d8);
      if (iVar2 != 0) {
        test_cold_5();
        goto LAB_0010285c;
      }
      if (local_1d8 < 0) {
        fprintf(_stderr,
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                ,0x34);
        iVar1 = -1;
        iVar2 = 0x7a;
      }
      else {
        tVar7 = tutil_tvnow();
        lVar5 = tutil_tvdiff(tVar7,tv_test_start);
        if (lVar5 < 0xea61) {
          local_1d0 = lVar4;
          if (local_1d8 != 0) {
            do {
              local_1d4 = -99;
              local_b8.__fds_bits[0] = 0;
              local_b8.__fds_bits[1] = 0;
              local_b8.__fds_bits[2] = 0;
              local_b8.__fds_bits[3] = 0;
              local_b8.__fds_bits[4] = 0;
              local_b8.__fds_bits[5] = 0;
              local_b8.__fds_bits[6] = 0;
              local_b8.__fds_bits[7] = 0;
              local_b8.__fds_bits[8] = 0;
              local_b8.__fds_bits[9] = 0;
              local_b8.__fds_bits[10] = 0;
              local_b8.__fds_bits[0xb] = 0;
              local_b8.__fds_bits[0xc] = 0;
              local_b8.__fds_bits[0xd] = 0;
              local_b8.__fds_bits[0xe] = 0;
              local_b8.__fds_bits[0xf] = 0;
              local_138.__fds_bits[0] = 0;
              local_138.__fds_bits[1] = 0;
              local_138.__fds_bits[2] = 0;
              local_138.__fds_bits[3] = 0;
              local_138.__fds_bits[4] = 0;
              local_138.__fds_bits[5] = 0;
              local_138.__fds_bits[6] = 0;
              local_138.__fds_bits[7] = 0;
              local_138.__fds_bits[8] = 0;
              local_138.__fds_bits[9] = 0;
              local_138.__fds_bits[10] = 0;
              local_138.__fds_bits[0xb] = 0;
              local_138.__fds_bits[0xc] = 0;
              local_138.__fds_bits[0xd] = 0;
              local_138.__fds_bits[0xe] = 0;
              local_138.__fds_bits[0xf] = 0;
              local_1b8.__fds_bits[0xe] = 0;
              local_1b8.__fds_bits[0xf] = 0;
              local_1b8.__fds_bits[0xc] = 0;
              local_1b8.__fds_bits[0xd] = 0;
              local_1b8.__fds_bits[10] = 0;
              local_1b8.__fds_bits[0xb] = 0;
              local_1b8.__fds_bits[8] = 0;
              local_1b8.__fds_bits[9] = 0;
              local_1b8.__fds_bits[6] = 0;
              local_1b8.__fds_bits[7] = 0;
              local_1b8.__fds_bits[4] = 0;
              local_1b8.__fds_bits[5] = 0;
              local_1b8.__fds_bits[2] = 0;
              local_1b8.__fds_bits[3] = 0;
              local_1b8.__fds_bits[0] = 0;
              local_1b8.__fds_bits[1] = 0;
              local_1c8.tv_sec = 1;
              local_1c8.tv_usec = 0;
              iVar1 = curl_multi_fdset(lVar3,&local_b8,&local_138,&local_1b8,&local_1d4);
              if (iVar1 != 0) {
                test_cold_7();
                goto LAB_0010292d;
              }
              if (local_1d4 < -1) {
                __format = 
                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                uVar6 = 0x45;
LAB_00102915:
                fprintf(_stderr,__format,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib507.c"
                        ,uVar6);
                iVar1 = 0x7a;
                goto LAB_0010292d;
              }
              iVar1 = select_wrapper(local_1d4 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
              if (iVar1 == -1) {
                test_cold_11();
                iVar1 = 0x79;
                goto LAB_0010292d;
              }
              tVar7 = tutil_tvnow();
              lVar4 = tutil_tvdiff(tVar7,tv_test_start);
              if (60000 < lVar4) {
                test_cold_8();
LAB_00102928:
                iVar1 = 0x7d;
                goto LAB_0010292d;
              }
              iVar1 = curl_multi_perform(lVar3,&local_1d8);
              if (iVar1 != 0) {
                test_cold_9();
                goto LAB_0010292d;
              }
              if (local_1d8 < 0) {
                __format = 
                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                ;
                uVar6 = 0x4d;
                goto LAB_00102915;
              }
              tVar7 = tutil_tvnow();
              lVar4 = tutil_tvdiff(tVar7,tv_test_start);
              if (60000 < lVar4) {
                test_cold_10();
                goto LAB_00102928;
              }
            } while (local_1d8 != 0);
          }
          lVar4 = curl_multi_info_read(lVar3,&local_1d8);
          iVar2 = 0;
          iVar1 = 0;
          if (lVar4 == 0) {
LAB_0010292d:
            iVar2 = iVar1;
            iVar1 = -1;
            lVar4 = local_1d0;
          }
          else {
            iVar1 = *(int *)(lVar4 + 0x10);
            lVar4 = local_1d0;
          }
        }
        else {
          test_cold_6();
          iVar1 = -1;
          iVar2 = 0x7d;
        }
      }
    }
    else {
      test_cold_2();
LAB_0010285c:
      iVar1 = -1;
    }
  }
  curl_multi_cleanup(lVar3);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_00102953:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL* curls = NULL;
  CURLM* multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}